

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3e58a::reportTypeMismatch
          (anon_unknown_dwarf_3e58a *this,bool *valid,char *kind,Importable *import)

{
  size_t sVar1;
  ostream *poVar2;
  Name name;
  Name name_00;
  Name name_01;
  
  *this = (anon_unknown_dwarf_3e58a)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Type mismatch when importing ",0x1d);
  if (valid == (bool *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1282b0);
  }
  else {
    sVar1 = strlen(valid);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,valid,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
  name.super_IString.str._M_str = (char *)import;
  name.super_IString.str._M_len = *(size_t *)(kind + 0x30);
  poVar2 = wasm::operator<<((wasm *)&std::cerr,*(ostream **)(kind + 0x28),name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," from module ",0xd);
  name_00.super_IString.str._M_str = (char *)import;
  name_00.super_IString.str._M_len = *(size_t *)(kind + 0x20);
  poVar2 = wasm::operator<<((wasm *)poVar2,*(ostream **)(kind + 0x18),name_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ($",3);
  name_01.super_IString.str._M_str = (char *)import;
  name_01.super_IString.str._M_len = *(size_t *)(kind + 8);
  poVar2 = wasm::operator<<((wasm *)poVar2,*(ostream **)kind,name_01);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"): ",3);
  return;
}

Assistant:

void reportTypeMismatch(bool& valid, const char* kind, Importable* import) {
  valid = false;
  std::cerr << "Type mismatch when importing " << kind << " " << import->base
            << " from module " << import->module << " ($" << import->name
            << "): ";
}